

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O2

bool __thiscall DBot::Reachable(DBot *this,AActor *rtarget)

{
  APlayerPawn *pAVar1;
  line_t_conflict *plVar2;
  bool bVar3;
  intercept_t *piVar4;
  bool bVar5;
  sector_t_conflict *psVar6;
  sector_t_conflict *sec;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_90;
  FPathTraverse it;
  
  if (this->player->mo != (APlayerPawn *)rtarget) {
    dVar7 = secplane_t::ZatPoint(&rtarget->Sector->ceilingplane,rtarget);
    dVar8 = secplane_t::ZatPoint(&rtarget->Sector->floorplane,rtarget);
    pAVar1 = this->player->mo;
    if ((pAVar1->super_AActor).Height <= dVar7 - dVar8) {
      psVar6 = (sector_t_conflict *)(pAVar1->super_AActor).Sector;
      local_90 = secplane_t::ZatPoint(&psVar6->floorplane,&pAVar1->super_AActor);
      dVar7 = AActor::Distance2D(&this->player->mo->super_AActor,rtarget,false);
      pAVar1 = this->player->mo;
      FPathTraverse::FPathTraverse
                (&it,(pAVar1->super_AActor).__Pos.X + (pAVar1->super_AActor).Vel.X,
                 (pAVar1->super_AActor).__Pos.Y + (pAVar1->super_AActor).Vel.Y,(rtarget->__Pos).X,
                 (rtarget->__Pos).Y,3,0.0);
      bVar5 = true;
      do {
        while( true ) {
          piVar4 = FPathTraverse::Next(&it);
          bVar3 = bVar5;
          if (piVar4 == (intercept_t *)0x0) goto LAB_003684a7;
          dVar8 = piVar4->frac + -0.00262144;
          pAVar1 = this->player->mo;
          if (piVar4->isaline == true) break;
          bVar3 = true;
          if (dVar7 < dVar8 * 1525.87890625) goto LAB_003684a7;
          if (((APlayerPawn *)(piVar4->d).thing != pAVar1) &&
             (bVar5 = false, (APlayerPawn *)(piVar4->d).thing == (APlayerPawn *)rtarget)) {
            dVar8 = secplane_t::ZatPoint(&rtarget->Sector->floorplane,rtarget);
            bVar5 = false;
            if (dVar8 <= local_90 + 32.0) goto LAB_003684a7;
          }
        }
        plVar2 = (piVar4->d).line;
        if ((plVar2->flags & 0xc005) != 4) break;
        sec = plVar2->backsector;
        if (sec == psVar6) {
          sec = plVar2->frontsector;
        }
        dVar9 = (pAVar1->super_AActor).Vel.X * dVar8 + it.trace.x;
        dVar8 = dVar8 * (pAVar1->super_AActor).Vel.Y + it.trace.y;
        dVar10 = ((sec->ceilingplane).normal.Y * dVar8 +
                 (sec->ceilingplane).normal.X * dVar9 + (sec->ceilingplane).D) *
                 (sec->ceilingplane).negiC;
        dVar8 = (dVar8 * (sec->floorplane).normal.Y +
                dVar9 * (sec->floorplane).normal.X + (sec->floorplane).D) * (sec->floorplane).negiC;
        bVar3 = FCajunMaster::IsDangerous(&bglobal,(sector_t *)sec);
        if (bVar3 || local_90 + 32.0 < dVar8) break;
        psVar6 = sec;
        local_90 = dVar8;
      } while ((((dVar10 == dVar8) && (!NAN(dVar10) && !NAN(dVar8))) && (plVar2->special != 0)) ||
              ((this->player->mo->super_AActor).Height <= dVar10 - dVar8));
      bVar3 = false;
LAB_003684a7:
      FPathTraverse::~FPathTraverse(&it);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool DBot::Reachable (AActor *rtarget)
{
	if (player->mo == rtarget)
		return false;

	if ((rtarget->Sector->ceilingplane.ZatPoint (rtarget) -
		 rtarget->Sector->floorplane.ZatPoint (rtarget))
		< player->mo->Height) //Where rtarget is, player->mo can't be.
		return false;

	sector_t *last_s = player->mo->Sector;
	double last_z = last_s->floorplane.ZatPoint (player->mo);
	double estimated_dist = player->mo->Distance2D(rtarget);
	bool reachable = true;

	FPathTraverse it(player->mo->X()+player->mo->Vel.X, player->mo->Y()+player->mo->Vel.Y, rtarget->X(), rtarget->Y(), PT_ADDLINES|PT_ADDTHINGS);
	intercept_t *in;
	while ((in = it.Next()))
	{
		double hitx, hity;
		double frac;
		line_t *line;
		AActor *thing;
		double dist;
		sector_t *s;

		frac = in->frac - 4 /MAX_TRAVERSE_DIST;
		dist = frac * MAX_TRAVERSE_DIST;

		hitx = it.Trace().x + player->mo->Vel.X * frac;
		hity = it.Trace().y + player->mo->Vel.Y * frac;

		if (in->isaline)
		{
			line = in->d.line;

			if (!(line->flags & ML_TWOSIDED) || (line->flags & (ML_BLOCKING|ML_BLOCKEVERYTHING|ML_BLOCK_PLAYERS)))
			{
				return false; //Cannot continue.
			}
			else
			{
				//Determine if going to use backsector/frontsector.
				s = (line->backsector == last_s) ? line->frontsector : line->backsector;
				double ceilingheight = s->ceilingplane.ZatPoint (hitx, hity);
				double floorheight = s->floorplane.ZatPoint (hitx, hity);

				if (!bglobal.IsDangerous (s) &&		//Any nukage/lava?
					(floorheight <= (last_z+MAXMOVEHEIGHT)
					&& ((ceilingheight == floorheight && line->special)
						|| (ceilingheight - floorheight) >= player->mo->Height))) //Does it fit?
				{
					last_z = floorheight;
					last_s = s;
					continue;
				}
				else
				{
					return false;
				}
			}
		}

		if (dist > estimated_dist)
		{
			return true;
		}

		thing = in->d.thing;
		if (thing == player->mo) //Can't reach self in this case.
			continue;
		if (thing == rtarget && (rtarget->Sector->floorplane.ZatPoint (rtarget) <= (last_z+MAXMOVEHEIGHT)))
		{
			return true;
		}

		reachable = false;
	}
	return reachable;
}